

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_encode_file(char *filename,uchar *image,uint w,uint h,LodePNGColorType colortype,
                        uint bitdepth)

{
  uint uVar1;
  undefined4 in_R9D;
  uint error;
  size_t buffersize;
  uchar *buffer;
  LodePNGColorType in_stack_00000184;
  uint in_stack_00000188;
  uint in_stack_0000018c;
  uchar *in_stack_00000190;
  size_t *in_stack_00000198;
  uchar **in_stack_000001a0;
  uint in_stack_000001b0;
  undefined4 in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  
  uVar1 = lodepng_encode_memory
                    (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_0000018c,
                     in_stack_00000188,in_stack_00000184,in_stack_000001b0);
  if (uVar1 == 0) {
    uVar1 = lodepng_save_file((uchar *)(ulong)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                              (char *)CONCAT44(in_stack_ffffffffffffffbc,in_R9D));
  }
  lodepng_free((void *)0x2b7886);
  return uVar1;
}

Assistant:

unsigned lodepng_encode_file(const char* filename, const unsigned char* image, unsigned w, unsigned h,
                             LodePNGColorType colortype, unsigned bitdepth)
{
  unsigned char* buffer;
  size_t buffersize;
  unsigned error = lodepng_encode_memory(&buffer, &buffersize, image, w, h, colortype, bitdepth);
  if(!error) error = lodepng_save_file(buffer, buffersize, filename);
  lodepng_free(buffer);
  return error;
}